

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall ON_EarthAnchorPoint::Write(ON_EarthAnchorPoint *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  uint i;
  double x;
  double x_00;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,2);
  if (!bVar1) {
    return false;
  }
  x = Internal_UnsetToZeroInV5Files(file,this->m_earth_latitude);
  x_00 = Internal_UnsetToZeroInV5Files(file,this->m_earth_longitude);
  bVar1 = ON_BinaryArchive::WriteDouble(file,x);
  if ((((bVar1) && (bVar1 = ON_BinaryArchive::WriteDouble(file,x_00), bVar1)) &&
      (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_earth_elevation_meters), bVar1)) &&
     (((bVar1 = ON_BinaryArchive::WritePoint(file,&this->m_model_point), bVar1 &&
       (bVar1 = ON_BinaryArchive::WriteVector(file,&this->m_model_north), bVar1)) &&
      (bVar1 = ON_BinaryArchive::WriteVector(file,&this->m_model_east), bVar1)))) {
    i = (uint)(this->m_earth_coordinate_system == MeanSeaLevel);
    if (this->m_earth_coordinate_system == CenterOfEarth) {
      i = 2;
    }
    bVar1 = ON_BinaryArchive::WriteInt(file,i);
    if (((bVar1) && (bVar1 = ON_BinaryArchive::WriteUuid(file,&this->m_id), bVar1)) &&
       ((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_name), bVar1 &&
        (((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_description), bVar1 &&
          (bVar1 = ON_BinaryArchive::WriteString(file,&this->m_url), bVar1)) &&
         (bVar1 = ON_BinaryArchive::WriteString(file,&this->m_url_tag), bVar1)))))) {
      bVar1 = ON_BinaryArchive::WriteInt(file,(uint)Unset.m_earth_coordinate_system);
      goto LAB_003abb18;
    }
  }
  bVar1 = false;
LAB_003abb18:
  bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_EarthAnchorPoint::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,2);
  if ( !rc )
    return false;

  for(;;)
  {
    const double earth_latitude = Internal_UnsetToZeroInV5Files(file, m_earth_latitude);
    const double earth_longitude = Internal_UnsetToZeroInV5Files(file, m_earth_longitude);
    rc = file.WriteDouble(earth_latitude);
    if (!rc) break;
    rc = file.WriteDouble(earth_longitude);
    if (!rc) break;
    rc = file.WriteDouble(m_earth_elevation_meters);
    if (!rc) break;
    rc = file.WritePoint(m_model_point);
    if (!rc) break;
    rc = file.WriteVector(m_model_north);
    if (!rc) break;
    rc = file.WriteVector(m_model_east);
    if (!rc) break;

    // 1.1 fields
    int earth_basepoint_elevation_zero;
    switch (m_earth_coordinate_system)
    {
    case ON::EarthCoordinateSystem::GroundLevel:
      earth_basepoint_elevation_zero = 0;
      break;
    case ON::EarthCoordinateSystem::MeanSeaLevel:
      earth_basepoint_elevation_zero = 1;
      break;
    case ON::EarthCoordinateSystem::CenterOfEarth:
      earth_basepoint_elevation_zero = 2;
      break;
    default:
      earth_basepoint_elevation_zero = 0;
      break;
    }
    rc = file.WriteInt(earth_basepoint_elevation_zero); // legacy value for old files
    if (!rc) break;
    rc = file.WriteUuid(m_id);
    if (!rc) break;
    rc = file.WriteString(m_name);
    if (!rc) break;
    rc = file.WriteString(m_description);
    if (!rc) break;
    rc = file.WriteString(m_url);
    if (!rc) break;
    rc = file.WriteString(m_url_tag);
    if (!rc) break;

    // 1.2 fields
    unsigned int u;
    u = static_cast<unsigned char>(ON_EarthAnchorPoint::Unset.EarthCoordinateSystem());
    rc = file.WriteInt(u);
    if (!rc) break;

    break;
  }

  if ( !file.EndWrite3dmChunk() )
    rc = false;

  return rc;
}